

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O1

void __thiscall
Catch::JunitReporter::writeGroup(JunitReporter *this,TestGroupNode *groupNode,double suiteTime)

{
  XmlWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer psVar3;
  XmlWriter *this_01;
  undefined8 this_02;
  int iVar4;
  tm *__tp;
  undefined4 extraout_var;
  XmlFormatting fmt;
  _anonymous_namespace_ *this_03;
  shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>
  *child;
  pointer psVar5;
  char timeStamp [21];
  size_type __dnew;
  time_t rawtime;
  ScopedElement e;
  string local_e8;
  string local_c8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [32];
  undefined1 local_58 [24];
  
  paVar1 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  local_58._0_8_ = suiteTime;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"testsuite","");
  this_00 = &this->xml;
  fmt = (XmlFormatting)&local_e8;
  XmlWriter::scopedElement((XmlWriter *)&stack0xffffffffffffffc0,(string *)this_00,fmt);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"name","");
  XmlWriter::writeAttribute(this_00,&local_e8,&(groupNode->value).groupInfo.name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"errors","");
  XmlWriter::writeAttribute<unsigned_int>(this_00,&local_e8,&this->unexpectedExceptions);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"failures","");
  local_c8._M_dataplus._M_p =
       (pointer)((groupNode->value).totals.assertions.failed - (ulong)this->unexpectedExceptions);
  XmlWriter::writeAttribute<unsigned_long>(this_00,&local_e8,(unsigned_long *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"tests","");
  local_c8._M_dataplus._M_p =
       (pointer)((groupNode->value).totals.assertions.failed +
                 (groupNode->value).totals.assertions.passed +
                (groupNode->value).totals.assertions.failedButOk);
  XmlWriter::writeAttribute<unsigned_long>(this_00,&local_e8,(unsigned_long *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"hostname","");
  XmlWriter::writeAttribute<char[4]>(this_00,&local_e8,(char (*) [4])"tbd");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  iVar4 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xb])();
  if (iVar4 == 2) {
    local_e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"time","");
    XmlWriter::writeAttribute<char[1]>(this_00,&local_e8,(char (*) [1])0x18d1bb);
  }
  else {
    this_03 = (_anonymous_namespace_ *)0x18d11b;
    local_e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"time","");
    (anonymous_namespace)::formatDuration_abi_cxx11_(&local_c8,this_03,(double)local_58._0_8_);
    XmlWriter::writeAttribute(this_00,&local_e8,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"timestamp","");
  time((time_t *)(local_58 + 8));
  __tp = gmtime((time_t *)(local_58 + 8));
  strftime(local_a8,0x15,"%Y-%m-%dT%H:%M:%SZ",__tp);
  paVar2 = &local_c8.field_2;
  local_88._0_8_ = (XmlWriter *)0x14;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  local_c8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_c8,(ulong)local_88);
  local_c8.field_2._M_allocated_capacity = local_88._0_8_;
  *(undefined4 *)(local_c8._M_dataplus._M_p + 0x10) = local_98._0_4_;
  *(undefined8 *)local_c8._M_dataplus._M_p = local_a8._0_8_;
  *(undefined8 *)(local_c8._M_dataplus._M_p + 8) = local_a8._8_8_;
  local_c8._M_string_length = local_88._0_8_;
  local_c8._M_dataplus._M_p[local_88._0_8_] = '\0';
  XmlWriter::writeAttribute(this_00,&local_e8,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,(ulong)(local_c8.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  iVar4 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xe])();
  if ((char)iVar4 == '\0') {
    iVar4 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[0x11])();
    if (iVar4 == 0) goto LAB_0012efb9;
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"properties","");
  XmlWriter::scopedElement((XmlWriter *)(local_58 + 8),(string *)this_00,fmt);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  iVar4 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xe])();
  if ((char)iVar4 != '\0') {
    local_e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"property","");
    XmlWriter::scopedElement((XmlWriter *)(local_78 + 0x10),(string *)this_00,fmt);
    local_c8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"name","");
    this_01 = (XmlWriter *)CONCAT44(local_78._20_4_,local_78._16_4_);
    XmlWriter::writeAttribute<char[8]>(this_01,&local_c8,(char (*) [8])"filters");
    local_a8._0_8_ = (XmlWriter *)local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"value","");
    iVar4 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[0xf])();
    serializeFilters((string *)local_88,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(extraout_var,iVar4));
    XmlWriter::writeAttribute(this_01,(string *)local_a8,(string *)local_88);
    if ((XmlWriter *)local_88._0_8_ != (XmlWriter *)local_78) {
      operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
    }
    if ((XmlWriter *)local_a8._0_8_ != (XmlWriter *)local_98) {
      operator_delete((void *)local_a8._0_8_,CONCAT44(local_98._4_4_,local_98._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,(ulong)(local_c8.field_2._M_allocated_capacity + 1))
      ;
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_78 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0x11])();
  if (iVar4 != 0) {
    local_e8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"property","");
    XmlWriter::scopedElement((XmlWriter *)local_88,(string *)this_00,fmt);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"name","");
    this_02 = local_88._0_8_;
    XmlWriter::writeAttribute<char[12]>
              ((XmlWriter *)local_88._0_8_,&local_c8,(char (*) [12])"random-seed");
    local_a8._0_8_ = (XmlWriter *)local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"value","");
    local_78._16_4_ =
         (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
             super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_NonCopyable)._vptr_NonCopyable[0x11])();
    XmlWriter::writeAttribute<unsigned_int>
              ((XmlWriter *)this_02,(string *)local_a8,(uint *)(local_78 + 0x10));
    if ((XmlWriter *)local_a8._0_8_ != (XmlWriter *)local_98) {
      operator_delete((void *)local_a8._0_8_,CONCAT44(local_98._4_4_,local_98._0_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,(ulong)(local_c8.field_2._M_allocated_capacity + 1))
      ;
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_58 + 8));
LAB_0012efb9:
  psVar3 = (groupNode->children).
           super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar5 = (groupNode->children).
                super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar3; psVar5 = psVar5 + 1) {
    writeTestCase(this,(psVar5->
                       super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"system-out","");
  XmlWriter::scopedElement((XmlWriter *)local_a8,(string *)this_00,fmt);
  trim(&local_c8,&this->stdOutForSuite);
  XmlWriter::writeText((XmlWriter *)local_a8._0_8_,&local_c8,Newline);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,(ulong)(local_c8.field_2._M_allocated_capacity + 1));
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"system-err","");
  XmlWriter::scopedElement((XmlWriter *)local_a8,(string *)this_00,fmt);
  trim(&local_c8,&this->stdErrForSuite);
  XmlWriter::writeText((XmlWriter *)local_a8._0_8_,&local_c8,Newline);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,(ulong)(local_c8.field_2._M_allocated_capacity + 1));
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void JunitReporter::writeGroup( TestGroupNode const& groupNode, double suiteTime ) {
        XmlWriter::ScopedElement e = xml.scopedElement( "testsuite" );

        TestGroupStats const& stats = groupNode.value;
        xml.writeAttribute( "name", stats.groupInfo.name );
        xml.writeAttribute( "errors", unexpectedExceptions );
        xml.writeAttribute( "failures", stats.totals.assertions.failed-unexpectedExceptions );
        xml.writeAttribute( "tests", stats.totals.assertions.total() );
        xml.writeAttribute( "hostname", "tbd" ); // !TBD
        if( m_config->showDurations() == ShowDurations::Never )
            xml.writeAttribute( "time", "" );
        else
            xml.writeAttribute( "time", formatDuration( suiteTime ) );
        xml.writeAttribute( "timestamp", getCurrentTimestamp() );

        // Write properties if there are any
        if (m_config->hasTestFilters() || m_config->rngSeed() != 0) {
            auto properties = xml.scopedElement("properties");
            if (m_config->hasTestFilters()) {
                xml.scopedElement("property")
                    .writeAttribute("name", "filters")
                    .writeAttribute("value", serializeFilters(m_config->getTestsOrTags()));
            }
            if (m_config->rngSeed() != 0) {
                xml.scopedElement("property")
                    .writeAttribute("name", "random-seed")
                    .writeAttribute("value", m_config->rngSeed());
            }
        }

        // Write test cases
        for( auto const& child : groupNode.children )
            writeTestCase( *child );

        xml.scopedElement( "system-out" ).writeText( trim( stdOutForSuite ), XmlFormatting::Newline );
        xml.scopedElement( "system-err" ).writeText( trim( stdErrForSuite ), XmlFormatting::Newline );
    }